

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O1

void __thiscall SslTcpServer::SslTcpServer(SslTcpServer *this)

{
  BaseSocketImpl *pBVar1;
  SslTcpServerImpl *this_00;
  
  (this->super_TcpServer).super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = (BaseSocketImpl *)0x0;
  (this->super_TcpServer).super_BaseSocket._vptr_BaseSocket =
       (_func_int **)&PTR__BaseSocket_00146d28;
  this_00 = (SslTcpServerImpl *)operator_new(0x1e8);
  SslTcpServerImpl::SslTcpServerImpl(this_00,(BaseSocket *)this);
  pBVar1 = (this->super_TcpServer).super_BaseSocket.Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  (this->super_TcpServer).super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = (BaseSocketImpl *)this_00;
  if (pBVar1 != (BaseSocketImpl *)0x0) {
    (*pBVar1->_vptr_BaseSocketImpl[1])();
    return;
  }
  return;
}

Assistant:

SslTcpServer::SslTcpServer() : TcpServer(false)
{
    Impl_ = make_unique<SslTcpServerImpl>(this);
}